

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productAndSetup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  cpp_dec_float<50U,_int,_void> *this_00;
  cpp_dec_float<50U,_int,_void> *pcVar1;
  cpp_dec_float<50U,_int,_void> *this_01;
  bool bVar2;
  pointer pnVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *v;
  ulong uVar12;
  Real a;
  type t;
  int local_124;
  undefined1 local_108 [16];
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint local_e8;
  undefined3 uStack_e3;
  int local_e0;
  bool local_dc;
  undefined8 local_d8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c8;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [4];
  fpclass_type local_48;
  undefined8 uStack_40;
  
  uVar9 = (int)((long)(x->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(x->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  local_c0 = A;
  if (uVar9 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
    (x->super_IdxSet).num = 0;
  }
  else {
    if ((int)uVar9 < 1) {
      local_124 = 0;
    }
    else {
      uVar12 = 0;
      this_01 = (cpp_dec_float<50U,_int,_void> *)local_108;
      local_124 = 0;
      local_c8 = x;
      do {
        pnVar3 = (x->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = &pnVar3[uVar12].m_backend;
        if (pnVar3[uVar12].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00293c66:
          local_58._0_8_ = *(undefined8 *)((this_00->data)._M_elems + 8);
          local_78 = *(uint (*) [2])(this_00->data)._M_elems;
          auStack_70 = *(uint (*) [2])((this_00->data)._M_elems + 2);
          local_68 = *(uint (*) [2])((this_00->data)._M_elems + 4);
          auStack_60 = *(uint (*) [2])((this_00->data)._M_elems + 6);
          iVar8 = this_00->exp;
          bVar2 = this_00->neg;
          uVar6._0_4_ = this_00->fpclass;
          uVar6._4_4_ = this_00->prec_elem;
          uStack_40 = 0;
          _local_48 = uVar6;
          a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
          local_b8.data._M_elems[8] = local_58[0];
          local_b8.data._M_elems[9] = local_58[1];
          local_b8.data._M_elems[4] = local_68[0];
          local_b8.data._M_elems[5] = local_68[1];
          local_b8.data._M_elems[6] = auStack_60[0];
          local_b8.data._M_elems[7] = auStack_60[1];
          local_b8.data._M_elems[0] = local_78[0];
          local_b8.data._M_elems[1] = local_78[1];
          uVar7 = local_b8.data._M_elems._0_8_;
          local_b8.data._M_elems[2] = auStack_70[0];
          local_b8.data._M_elems[3] = auStack_70[1];
          local_b8.neg = bVar2;
          if ((bVar2 == true) &&
             (local_b8.data._M_elems[0] = local_78[0],
             local_b8.data._M_elems[0] != 0 || local_48 != cpp_dec_float_finite)) {
            local_b8.neg = false;
          }
          local_b8.data._M_elems._0_8_ = uVar7;
          local_b8.exp = iVar8;
          local_b8._48_8_ = uVar6;
          if ((local_48 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_d8._0_4_ = cpp_dec_float_finite;
            local_d8._4_4_ = 10;
            local_108 = (undefined1  [16])0x0;
            local_f8 = 0;
            uStack_f4 = 0;
            uStack_f0 = 0;
            uStack_ec = 0;
            _local_e8 = 0;
            uStack_e3 = 0;
            local_e0 = 0;
            local_dc = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)this_01,a);
            iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_b8,this_01);
            if (0 < iVar8) {
              pIVar4 = (local_c0->set).theitem;
              iVar8 = (local_c0->set).thekey[uVar12].idx;
              lVar11 = (long)local_124;
              local_124 = local_124 + 1;
              (x->super_IdxSet).idx[lVar11] = (int)uVar12;
              lVar11 = (long)pIVar4[iVar8].data.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .memused;
              if (0 < lVar11) {
                lVar10 = lVar11 + 1;
                lVar11 = lVar11 * 0x3c;
                do {
                  pNVar5 = pIVar4[iVar8].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem;
                  pcVar1 = (cpp_dec_float<50U,_int,_void> *)
                           ((long)&pNVar5[-1].val.m_backend.data + lVar11);
                  local_d8._0_4_ = cpp_dec_float_finite;
                  local_d8._4_4_ = 10;
                  _local_e8 = 0;
                  uStack_e3 = 0;
                  local_e0 = 0;
                  local_dc = false;
                  local_f8 = 0;
                  uStack_f4 = 0;
                  uStack_f0 = 0;
                  uStack_ec = 0;
                  local_108 = ZEXT816(0);
                  v = pcVar1;
                  if (pcVar1 == this_01) {
                    v = this_00;
                  }
                  if (pcVar1 != this_01 && this_01 != this_00) {
                    uVar6 = *(undefined8 *)((this_00->data)._M_elems + 8);
                    _local_e8 = (undefined5)uVar6;
                    uStack_e3 = (undefined3)((ulong)uVar6 >> 0x28);
                    local_108 = *(undefined1 (*) [16])(this_00->data)._M_elems;
                    local_f8 = (this_00->data)._M_elems[4];
                    uStack_f4 = (this_00->data)._M_elems[5];
                    uStack_f0 = (this_00->data)._M_elems[6];
                    uStack_ec = (this_00->data)._M_elems[7];
                    local_e0 = this_00->exp;
                    local_dc = this_00->neg;
                    local_d8._0_4_ = this_00->fpclass;
                    local_d8._4_4_ = this_00->prec_elem;
                    v = pcVar1;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                            (this_01,v);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)*(int *)((long)(&pNVar5[-1].val + 1) + lVar11) * 0x38 +
                             *(long *)(this + 0x20)),this_01);
                  lVar10 = lVar10 + -1;
                  x = local_c8;
                  lVar11 = lVar11 + -0x3c;
                } while (1 < lVar10);
              }
              goto LAB_00293eb4;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,0);
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (this_01,0,(type *)0x0);
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (this_00,this_01);
          if (iVar8 != 0) goto LAB_00293c66;
        }
LAB_00293eb4:
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uVar9 & 0x7fffffff));
    }
    (x->super_IdxSet).num = local_124;
    this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )0x0;
  }
  x->setupStatus = true;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productAndSetup(const SVSetBase<S>& A, SSVectorBase<T>& x)
{
   assert(!x.isSetup());

   if(x.dim() == 0)
   {
      // x == 0 => this := zero vector
      clear();
      x.num = 0;
   }
   else
   {
      // x is not setup, so walk through its value vector
      int nzcount = 0;
      int end = x.dim();

      for(int i = 0; i < end; ++i)
      {
         // advance to the next element != 0
         T& xval = x.val[i];

         if(xval != 0)
         {
            // If x[i] is really nonzero, compute A[i] * x[i] and adapt x.idx,
            // otherwise set x[i] to 0.
            if(isNotZero(xval, this->tolerances()->epsilon()))
            {
               const SVectorBase<S>& Ai = A[i];
               x.idx[ nzcount++ ] = i;

               for(int j = Ai.size() - 1; j >= 0; --j)
               {
                  const Nonzero<S>& elt = Ai.element(j);
                  VectorBase<R>::val[elt.idx] += xval * elt.val;
               }
            }
            else
               xval = 0;
         }
      }

      x.num = nzcount;
      setupStatus = false;
   }

   x.setupStatus = true;

   assert(isConsistent());

   return *this;
}